

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

int ABC_AddGate(ABC_Manager mng,GateType type,char *name,int nofi,char **fanins,int dc_attr)

{
  Mem_Flex_t *p;
  int iVar1;
  size_t sVar2;
  char *__dest;
  Abc_Obj_t *pObj;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  Abc_Obj_t *pFanin;
  GateType local_3c;
  char *local_38;
  
  p = mng->pMmNames;
  sVar2 = strlen(name);
  __dest = Mem_FlexEntryFetch(p,(int)sVar2 + 1);
  strcpy(__dest,name);
  if (type < CSAT_BCNF) {
    if ((0x7f9U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) {
      if ((6U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) {
        if ((0x60000U >> (type & (CSAT_BBUS|CSAT_BTRIL)) & 1) == 0) goto LAB_0043b510;
        if (nofi != 1) {
          pcVar4 = "ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_0043b703;
        }
        pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_PO);
        stmm_insert(mng->tNode2Name,(char *)pObj,__dest);
        iVar1 = stmm_lookup(mng->tName2Node,*fanins,(char **)&pFanin);
        if (iVar1 == 0) {
          __dest = *fanins;
LAB_0043b4e4:
          pcVar4 = "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n";
          goto LAB_0043b703;
        }
        Abc_ObjAddFanin(pObj,pFanin);
      }
      else {
        if (nofi != 0) {
          pcVar4 = "ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n";
          goto LAB_0043b703;
        }
        pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_PI);
        stmm_insert(mng->tNode2Name,(char *)pObj,__dest);
      }
    }
    else {
      local_3c = type;
      local_38 = __dest;
      pObj = Abc_NtkCreateObj(mng->pNtk,ABC_OBJ_NODE);
      uVar3 = 0;
      uVar5 = 0;
      if (0 < nofi) {
        uVar5 = (ulong)(uint)nofi;
      }
      for (; __dest = local_38, uVar5 != uVar3; uVar3 = uVar3 + 1) {
        iVar1 = stmm_lookup(mng->tName2Node,fanins[uVar3],(char **)&pFanin);
        if (iVar1 == 0) {
          __dest = fanins[uVar3];
          goto LAB_0043b4e4;
        }
        Abc_ObjAddFanin(pObj,pFanin);
      }
      pcVar4 = (char *)0x0;
      switch(local_3c) {
      case CSAT_CONST:
        if (nofi != 0) {
          pcVar4 = "ABC_AddGate: The constant gate \"%s\" has fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateConst1((Mem_Flex_t *)mng->pNtk->pManFunc);
        break;
      case CSAT_BAND:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The AND gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateAnd((Mem_Flex_t *)mng->pNtk->pManFunc,nofi,(int *)0x0);
        break;
      case CSAT_BNAND:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The NAND gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateNand((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BOR:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The OR gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateOr((Mem_Flex_t *)mng->pNtk->pManFunc,nofi,(int *)0x0);
        break;
      case CSAT_BNOR:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The NOR gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateNor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BXOR:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The XOR gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        if (2 < (uint)nofi) {
          pcVar4 = "ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateXor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BXNOR:
        if (nofi < 1) {
          pcVar4 = "ABC_AddGate: The XNOR gate \"%s\" no fanins.\n";
          goto LAB_0043b703;
        }
        if (2 < (uint)nofi) {
          pcVar4 = "ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateNxor((Mem_Flex_t *)mng->pNtk->pManFunc,nofi);
        break;
      case CSAT_BINV:
        if (nofi != 1) {
          pcVar4 = "ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateInv((Mem_Flex_t *)mng->pNtk->pManFunc);
        break;
      case CSAT_BBUF:
        if (nofi != 1) {
          pcVar4 = "ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n";
          goto LAB_0043b703;
        }
        pcVar4 = Abc_SopCreateBuf((Mem_Flex_t *)mng->pNtk->pManFunc);
      }
      (pObj->field_5).pData = pcVar4;
    }
  }
  else {
LAB_0043b510:
    puts("ABC_AddGate: Unknown gate type.");
    pObj = (Abc_Obj_t *)0x0;
  }
  iVar1 = stmm_insert(mng->tName2Node,__dest,(char *)pObj);
  if (iVar1 == 0) {
    return 1;
  }
  pcVar4 = "ABC_AddGate: The same gate \"%s\" is added twice.\n";
LAB_0043b703:
  printf(pcVar4,__dest);
  return 0;
}

Assistant:

int ABC_AddGate( ABC_Manager mng, enum GateType type, char * name, int nofi, char ** fanins, int dc_attr )
{
    Abc_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Abc_Obj_t * pFanin;
    char * pSop = NULL; // Suppress "might be used uninitialized"
    char * pNewName;
    int i;

    // save the name in the local memory manager
    pNewName = Mem_FlexEntryFetch( mng->pMmNames, strlen(name) + 1 );
    strcpy( pNewName, name );
    name = pNewName;

    // consider different cases, create the node, and map the node into the name
    switch( type )
    {
    case CSAT_BPI:
    case CSAT_BPPI:
        if ( nofi != 0 )
            { printf( "ABC_AddGate: The PI/PPI gate \"%s\" has fanins.\n", name ); return 0; }
        // create the PI
        pObj = Abc_NtkCreatePi( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        break;
    case CSAT_CONST:
    case CSAT_BAND:
    case CSAT_BNAND:
    case CSAT_BOR:
    case CSAT_BNOR:
    case CSAT_BXOR:
    case CSAT_BXNOR:
    case CSAT_BINV:
    case CSAT_BBUF:
        // create the node
        pObj = Abc_NtkCreateNode( mng->pNtk );
        // create the fanins
        for ( i = 0; i < nofi; i++ )
        {
            if ( !stmm_lookup( mng->tName2Node, fanins[i], (char **)&pFanin ) )
                { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[i] ); return 0; }
            Abc_ObjAddFanin( pObj, pFanin );
        }
        // create the node function
        switch( type )
        {
            case CSAT_CONST:
                if ( nofi != 0 )
                    { printf( "ABC_AddGate: The constant gate \"%s\" has fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateConst1( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The AND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateAnd( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNAND:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NAND gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNand( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The OR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateOr( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi, NULL );
                break;
            case CSAT_BNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The NOR gate \"%s\" no fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateXor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BXNOR:
                if ( nofi < 1 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" no fanins.\n", name ); return 0; }
                if ( nofi > 2 )
                    { printf( "ABC_AddGate: The XNOR gate \"%s\" has more than two fanins.\n", name ); return 0; }
                pSop = Abc_SopCreateNxor( (Mem_Flex_t *)mng->pNtk->pManFunc, nofi );
                break;
            case CSAT_BINV:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The inverter gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateInv( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            case CSAT_BBUF:
                if ( nofi != 1 )
                    { printf( "ABC_AddGate: The buffer gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
                pSop = Abc_SopCreateBuf( (Mem_Flex_t *)mng->pNtk->pManFunc );
                break;
            default :
                break;
        }
        Abc_ObjSetData( pObj, pSop );
        break;
    case CSAT_BPPO:
    case CSAT_BPO:
        if ( nofi != 1 )
            { printf( "ABC_AddGate: The PO/PPO gate \"%s\" does not have exactly one fanin.\n", name ); return 0; }
        // create the PO
        pObj = Abc_NtkCreatePo( mng->pNtk );
        stmm_insert( mng->tNode2Name, (char *)pObj, name );
        // connect to the PO fanin
        if ( !stmm_lookup( mng->tName2Node, fanins[0], (char **)&pFanin ) )
            { printf( "ABC_AddGate: The fanin gate \"%s\" is not in the network.\n", fanins[0] ); return 0; }
        Abc_ObjAddFanin( pObj, pFanin );
        break;
    default:
        printf( "ABC_AddGate: Unknown gate type.\n" );
        break;
    }

    // map the name into the node
    if ( stmm_insert( mng->tName2Node, name, (char *)pObj ) )
        { printf( "ABC_AddGate: The same gate \"%s\" is added twice.\n", name ); return 0; }
    return 1;
}